

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_setoneret(FuncState *fs,expdesc *e)

{
  Instruction *pIVar1;
  
  if (e->k == VVARARG) {
    pIVar1 = fs->f->code;
    pIVar1[(e->u).info] = pIVar1[(e->u).info] & 0x7fffff | 0x1000000;
    e->k = VRELOCABLE;
  }
  else if (e->k == VCALL) {
    e->k = VNONRELOC;
    (e->u).info = fs->f->code[(e->u).info] >> 6 & 0xff;
    return;
  }
  return;
}

Assistant:

void luaK_setoneret (FuncState *fs, expdesc *e) {
  if (e->k == VCALL) {  /* expression is an open function call? */
    /* already returns 1 value */
    lua_assert(GETARG_C(getinstruction(fs, e)) == 2);
    e->k = VNONRELOC;  /* result has fixed position */
    e->u.info = GETARG_A(getinstruction(fs, e));
  }
  else if (e->k == VVARARG) {
    SETARG_C(getinstruction(fs, e), 2);
    e->k = VRELOC;  /* can relocate its simple result */
  }
}